

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MQTT.hpp
# Opt level: O0

uint32 __thiscall
Protocol::MQTT::V5::PropertiesView::readFrom(PropertiesView *this,uint8 *_buffer,uint32 bufLength)

{
  bool bVar1;
  uint32 uVar2;
  uint32 uVar3;
  uint32 o;
  uint32 bufLength_local;
  uint8 *_buffer_local;
  PropertiesView *this_local;
  
  this_local._4_4_ = Common::VBInt::readFrom(&this->length,_buffer,bufLength);
  bVar1 = Common::isError(this_local._4_4_);
  if (!bVar1) {
    uVar2 = Common::VBInt::operator_cast_to_unsigned_int(&this->length);
    uVar3 = Common::VBInt::getSize(&this->length);
    if (bufLength - uVar3 < uVar2) {
      this_local._4_4_ = 0xfffffffe;
    }
    else {
      this->buffer = _buffer + this_local._4_4_;
      uVar2 = Common::VBInt::operator_cast_to_unsigned_int(&this->length);
      this_local._4_4_ = this_local._4_4_ + uVar2;
    }
  }
  return this_local._4_4_;
}

Assistant:

uint32 readFrom(const uint8 * _buffer, uint32 bufLength)
                {
                    uint32 o = length.readFrom(_buffer, bufLength);
                    if (isError(o)) return o;
                    if ((uint32)length > bufLength - length.getSize()) return NotEnoughData;
                    buffer = _buffer + o;
                    return o + (uint32)length;
                }